

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O1

void __thiscall
denialofservice_tests::block_relay_only_eviction::test_method(block_relay_only_eviction *this)

{
  AddrMan *addrman_in;
  NetGroupManager *netgroupman;
  Options opts;
  pointer ppCVar1;
  CChainParams *params;
  CConnman *pCVar2;
  int64_t iVar3;
  time_point tVar4;
  pointer ppCVar5;
  int iVar6;
  iterator pvVar7;
  iterator pvVar8;
  int i;
  long lVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  vector<CNode_*,_std::allocator<CNode_*>_> vNodes;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> peerLogic;
  __single_object connman;
  NodeId id;
  Options options;
  check_type cVar10;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  lazy_ostream local_1e0;
  undefined1 *local_1d0;
  char **local_1c8;
  assertion_result local_1c0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  vector<CNode_*,_std::allocator<CNode_*>_> local_188;
  undefined1 local_170 [16];
  NodeId local_160;
  undefined1 local_158 [48];
  uint64_t local_128;
  seconds local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> local_100;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> local_e8;
  vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_> local_d0;
  vector<CService,_std::allocator<CService>_> local_b8;
  vector<CService,_std::allocator<CService>_> local_a0;
  bool local_87;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  undefined1 auStack_68 [48];
  pointer local_38;
  
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  local_160 = 0;
  addrman_in = (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.addrman._M_t.
               super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  netgroupman = (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                super_BasicTestingSetup.m_node.netgroupman._M_t.
                super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
                .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
  params = Params();
  pCVar2 = (CConnman *)operator_new(0x488);
  CConnman::CConnman(pCVar2,0x1337,0x1337,addrman_in,netgroupman,params,true);
  auStack_68._32_2_ = 0;
  auStack_68._36_4_ = 100;
  auStack_68._40_4_ = 100;
  auStack_68._44_2_ = 0;
  _cVar10 = (check_type)((ulong)CONCAT42(100,auStack_68._34_2_) << 0x10);
  opts._8_8_ = (undefined8)_cVar10;
  opts._0_8_ = (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.warnings._M_t.
               super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
               super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
               super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  local_170._8_8_ = pCVar2;
  PeerManager::make((CConnman *)local_170,(AddrMan *)pCVar2,
                    (BanMan *)
                    (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(ChainstateManager *)0x0,
                    (CTxMemPool *)
                    (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.chainman._M_t.
                    super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                    .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                    (Warnings *)
                    (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,opts);
  local_158._0_8_ = (__pthread_internal_list *)0x0;
  local_158._8_4_ = 0;
  local_158._16_8_ = 0;
  local_158._24_8_ = (NetEventsInterface *)0x0;
  local_158._32_8_ = (BanMan *)0x0;
  local_158._40_8_ = 0;
  local_128 = 0;
  local_120.__r = 0x3c;
  memset(&local_118,0,0x90);
  local_87 = true;
  auStack_68._25_2_ = 0x100;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (_Elt_pointer)0x0;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (_Elt_pointer)0x0;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (_Elt_pointer)0x0;
  auStack_68._0_8_ = (pointer)0x0;
  auStack_68._8_8_ = 0;
  auStack_68._16_8_ = 0;
  local_158._8_4_ = 0x7d;
  CConnman::Init((CConnman *)local_170._8_8_,(Options *)local_158);
  local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar6 = 1;
  do {
    pvVar7 = (iterator)0x4;
    pCVar2 = (CConnman *)local_170._8_8_;
    OutboundTest::AddRandomOutboundPeer
              (&this->super_OutboundTest,&local_160,&local_188,(PeerManager *)local_170._0_8_,
               (ConnmanTestMsg *)local_170._8_8_,BLOCK_RELAY,false);
    iVar6 = iVar6 + -1;
  } while (iVar6 == 0);
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  lVar9 = 0;
  do {
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_190 = "";
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x105;
    file.m_begin = (iterator)&local_198;
    msg.m_end = pvVar7;
    msg.m_begin = (iterator)pCVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
    local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9]->fDisconnect)._M_base._M_i & 1);
    local_1c0.m_message.px = (element_type *)0x0;
    local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1f0 = "vNodes[i]->fDisconnect == false";
    local_1e8 = "";
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_1f0;
    local_200 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_1f8 = "";
    pCVar2 = (CConnman *)0x1;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c0,&local_1e0,1,0,WARN,_cVar10,(size_t)&local_200,0x105);
    boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
    lVar9 = lVar9 + 1;
  } while (lVar9 == 1);
  pvVar7 = (iterator)0x4;
  pCVar2 = (CConnman *)local_170._8_8_;
  OutboundTest::AddRandomOutboundPeer
            (&this->super_OutboundTest,&local_160,&local_188,(PeerManager *)local_170._0_8_,
             (ConnmanTestMsg *)local_170._8_8_,BLOCK_RELAY,false);
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  lVar9 = 0;
  do {
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_208 = "";
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    local_218 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x10e;
    file_00.m_begin = (iterator)&local_210;
    msg_00.m_end = pvVar7;
    msg_00.m_begin = (iterator)pCVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_220,
               msg_00);
    local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9]->fDisconnect)._M_base._M_i & 1);
    local_1c0.m_message.px = (element_type *)0x0;
    local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1f0 = "vNodes[i]->fDisconnect == false";
    local_1e8 = "";
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_1f0;
    local_230 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_228 = "";
    pCVar2 = (CConnman *)0x1;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c0,&local_1e0,1,0,WARN,_cVar10,(size_t)&local_230,0x10e);
    boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
    lVar9 = lVar9 + 1;
  } while (lVar9 == 1);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x110;
  file_01.m_begin = (iterator)&local_240;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = (iterator)pCVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_250,
             msg_01);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes.back()->fDisconnect == false";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_258 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar10,(size_t)&local_260,0x110);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  iVar3 = GetTime();
  SetMockTime(iVar3 + 0x1f);
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  lVar9 = 0;
  do {
    local_270 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_268 = "";
    local_280 = &boost::unit_test::basic_cstring<char_const>::null;
    local_278 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x115;
    file_02.m_begin = (iterator)&local_270;
    msg_02.m_end = pvVar8;
    msg_02.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_280,
               msg_02);
    local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9]->fDisconnect)._M_base._M_i & 1);
    local_1c0.m_message.px = (element_type *)0x0;
    local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1f0 = "vNodes[i]->fDisconnect == false";
    local_1e8 = "";
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_1f0;
    local_290 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_288 = "";
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c0,&local_1e0,1,0,WARN,_cVar10,(size_t)&local_290,0x115);
    boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
    lVar9 = lVar9 + 1;
  } while (lVar9 == 1);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x117;
  file_03.m_begin = (iterator)&local_2a0;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2b0,
             msg_03);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes.back()->fDisconnect == true";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2b8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar10,(size_t)&local_2c0,0x117);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  LOCK();
  (local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
   _M_finish[-1]->fDisconnect)._M_base._M_i = false;
  UNLOCK();
  tVar4 = NodeClock::now();
  LOCK();
  (local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
   _M_finish[-1]->m_last_block_time)._M_i.__r = (long)tVar4.__d.__r / 1000000000;
  UNLOCK();
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x120;
  file_04.m_begin = (iterator)&local_2d0;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2e0,
             msg_04);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (~((*local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start)->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes[i]->fDisconnect == false";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2e8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar10,(size_t)&local_2f0,0x120);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x122;
  file_05.m_begin = (iterator)&local_300;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_310,
             msg_05);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_start[1]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes[max_outbound_block_relay - 1]->fDisconnect == true";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_318 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar10,(size_t)&local_320,0x122);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x123;
  file_06.m_begin = (iterator)&local_330;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_340,
             msg_06);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes.back()->fDisconnect == false";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_348 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar10,(size_t)&local_350,0x123);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  ppCVar1 = local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar5 = local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar5 != ppCVar1; ppCVar5 = ppCVar5 + 1) {
    (*((NetEventsInterface *)(local_170._0_8_ + 8))->_vptr_NetEventsInterface[1])
              ((NetEventsInterface *)(local_170._0_8_ + 8),*ppCVar5);
  }
  ConnmanTestMsg::ClearTestNodes((ConnmanTestMsg *)local_170._8_8_);
  if (local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  std::vector<CService,_std::allocator<CService>_>::~vector(&local_a0);
  std::vector<CService,_std::allocator<CService>_>::~vector(&local_b8);
  std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>::~vector(&local_d0)
  ;
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector(&local_e8)
  ;
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
            (&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  if ((PeerManager *)local_170._0_8_ != (PeerManager *)0x0) {
    (**(code **)(*(long *)local_170._0_8_ + 0x58))();
  }
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::~unique_ptr
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)(local_170 + 8));
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(block_relay_only_eviction, OutboundTest)
{
    NodeId id{0};
    auto connman = std::make_unique<ConnmanTestMsg>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, nullptr, *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    constexpr int max_outbound_block_relay{MAX_BLOCK_RELAY_ONLY_CONNECTIONS};
    constexpr int64_t MINIMUM_CONNECT_TIME{30};
    CConnman::Options options;
    options.m_max_automatic_connections = DEFAULT_MAX_PEER_CONNECTIONS;

    connman->Init(options);
    std::vector<CNode*> vNodes;

    // Add block-relay-only peers up to the limit
    for (int i = 0; i < max_outbound_block_relay; ++i) {
        AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::BLOCK_RELAY);
    }
    peerLogic->CheckForStaleTipAndEvictPeers();

    for (int i = 0; i < max_outbound_block_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }

    // Add an extra block-relay-only peer breaking the limit (mocks logic in ThreadOpenConnections)
    AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::BLOCK_RELAY);
    peerLogic->CheckForStaleTipAndEvictPeers();

    // The extra peer should only get marked for eviction after MINIMUM_CONNECT_TIME
    for (int i = 0; i < max_outbound_block_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes.back()->fDisconnect == false);

    SetMockTime(GetTime() + MINIMUM_CONNECT_TIME + 1);
    peerLogic->CheckForStaleTipAndEvictPeers();
    for (int i = 0; i < max_outbound_block_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes.back()->fDisconnect == true);

    // Update the last block time for the extra peer,
    // and check that the next youngest peer gets evicted.
    vNodes.back()->fDisconnect = false;
    vNodes.back()->m_last_block_time = GetTime<std::chrono::seconds>();

    peerLogic->CheckForStaleTipAndEvictPeers();
    for (int i = 0; i < max_outbound_block_relay - 1; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes[max_outbound_block_relay - 1]->fDisconnect == true);
    BOOST_CHECK(vNodes.back()->fDisconnect == false);

    for (const CNode* node : vNodes) {
        peerLogic->FinalizeNode(*node);
    }
    connman->ClearTestNodes();
}